

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

void remove_zombie_request(LIBSSH2_SFTP *sftp,uint32_t request_id)

{
  LIBSSH2_SESSION *pLVar1;
  sftp_zombie_requests *entry;
  sftp_zombie_requests *zombie;
  LIBSSH2_SESSION *session;
  uint32_t request_id_local;
  LIBSSH2_SFTP *sftp_local;
  
  pLVar1 = sftp->channel->session;
  entry = find_zombie_request(sftp,request_id);
  if (entry != (sftp_zombie_requests *)0x0) {
    _libssh2_list_remove(&entry->node);
    (*pLVar1->free)(entry,&pLVar1->abstract);
  }
  return;
}

Assistant:

static void
remove_zombie_request(LIBSSH2_SFTP *sftp, uint32_t request_id)
{
    LIBSSH2_SESSION *session = sftp->channel->session;

    struct sftp_zombie_requests *zombie = find_zombie_request(sftp,
                                                              request_id);
    if(zombie) {
        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "Removing request ID %u from the list of "
                       "zombie requests",
                       request_id));

        _libssh2_list_remove(&zombie->node);
        LIBSSH2_FREE(session, zombie);
    }
}